

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall
GlobalBailOutRecordDataTable::AddOrUpdateRow
          (GlobalBailOutRecordDataTable *this,JitArenaAllocator *allocator,uint32 bailOutRecordId,
          uint32 regSlot,bool isFloat,bool isInt,int32 offset,uint *lastUpdatedRowIndex)

{
  uint uVar1;
  uint32 uVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  GlobalBailOutRecordDataRow *pGVar7;
  ulong uVar8;
  
  if (offset == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xbbf,"(offset != 0)","offset != 0");
    if (!bVar4) goto LAB_003ff147;
    *puVar6 = 0;
  }
  if (this->size == 0) {
    if (this->length != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0xbc3,"(length == 0)","length == 0");
      if (!bVar4) goto LAB_003ff147;
      *puVar6 = 0;
    }
    this->size = 0x40;
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_003ff147;
      *puVar6 = 0;
    }
    pGVar7 = (GlobalBailOutRecordDataRow *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           allocator,0x400);
    memset(pGVar7,0,0x400);
    this->globalBailOutRecordDataRows = pGVar7;
  }
  if (lastUpdatedRowIndex == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xbc8,"(lastUpdatedRowIndex != nullptr)","lastUpdatedRowIndex != nullptr");
    if (!bVar4) goto LAB_003ff147;
    *puVar6 = 0;
  }
  uVar8 = (ulong)*lastUpdatedRowIndex;
  if (uVar8 != 0xffffffff) {
    pGVar7 = this->globalBailOutRecordDataRows;
    if (pGVar7[uVar8].offset == offset) {
      uVar1 = *(uint *)&pGVar7[uVar8].field_0xc;
      if (((-1 < (int)uVar1 != isInt) && (((uVar1 >> 0x1e & 1) == 0) != isFloat)) &&
         (pGVar7[uVar8].end + 1 == bailOutRecordId)) {
        if ((uVar1 & 0x3fffffff) != regSlot) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0xbd2,"(rowToUpdate->regSlot == regSlot)",
                             "rowToUpdate->regSlot == regSlot");
          if (!bVar4) {
LAB_003ff147:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        pGVar7[uVar8].end = bailOutRecordId;
        return;
      }
    }
  }
  uVar1 = this->length;
  uVar8 = (ulong)uVar1;
  if (uVar1 == this->size) {
    this->size = uVar1 * 2;
    pGVar7 = (GlobalBailOutRecordDataRow *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Realloc
                       ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                        allocator,this->globalBailOutRecordDataRows,uVar8 << 4,
                        (ulong)(uVar1 * 2) << 4);
    this->globalBailOutRecordDataRows = pGVar7;
    uVar8 = (ulong)this->length;
  }
  else {
    pGVar7 = this->globalBailOutRecordDataRows;
  }
  pGVar7[uVar8].start = bailOutRecordId;
  pGVar7[uVar8].end = bailOutRecordId;
  pGVar7[uVar8].offset = offset;
  *(uint32 *)&pGVar7[uVar8].field_0xc =
       regSlot & 0x3fffffff | (uint)isFloat << 0x1e | (uint)isInt << 0x1f;
  uVar2 = this->length;
  this->length = uVar2 + 1;
  *lastUpdatedRowIndex = uVar2;
  return;
}

Assistant:

void  GlobalBailOutRecordDataTable::AddOrUpdateRow(JitArenaAllocator *allocator, uint32 bailOutRecordId, uint32 regSlot, bool isFloat, bool isInt, int32 offset, uint *lastUpdatedRowIndex)
{
    Assert(offset != 0);
    const int INITIAL_TABLE_SIZE = 64;
    if (size == 0)
    {
        Assert(length == 0);
        size = INITIAL_TABLE_SIZE;
        globalBailOutRecordDataRows = JitAnewArrayZ(allocator, GlobalBailOutRecordDataRow, size);
    }

    Assert(lastUpdatedRowIndex != nullptr);

    if ((*lastUpdatedRowIndex) != -1)
    {
        GlobalBailOutRecordDataRow *rowToUpdate = &globalBailOutRecordDataRows[(*lastUpdatedRowIndex)];
        if(rowToUpdate->offset == offset &&
            rowToUpdate->isInt == (unsigned)isInt &&
            rowToUpdate->isFloat == (unsigned)isFloat &&
            rowToUpdate->end + 1 == bailOutRecordId)
        {
            Assert(rowToUpdate->regSlot == regSlot);
            rowToUpdate->end = bailOutRecordId;
            return;
        }
    }

    if (length == size)
    {
        size = length << 1;
        globalBailOutRecordDataRows = (GlobalBailOutRecordDataRow *)allocator->Realloc(globalBailOutRecordDataRows, length * sizeof(GlobalBailOutRecordDataRow), size * sizeof(GlobalBailOutRecordDataRow));
    }
    GlobalBailOutRecordDataRow *rowToInsert = &globalBailOutRecordDataRows[length];
    rowToInsert->start = bailOutRecordId;
    rowToInsert->end = bailOutRecordId;
    rowToInsert->offset = offset;
    rowToInsert->isFloat = isFloat;
    rowToInsert->isInt = isInt;
    rowToInsert->regSlot = regSlot;
    *lastUpdatedRowIndex = length++;
}